

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Write
          (CopyingFileOutputStream *this,void *buffer,int size)

{
  void *pvVar1;
  int iVar2;
  LogMessage *other;
  ssize_t sVar3;
  int *piVar4;
  bool bVar5;
  int bytes;
  uint8 *buffer_base;
  LogFinisher local_75;
  int total_written;
  byte local_61;
  LogMessage local_60;
  int local_24;
  void *pvStack_20;
  int size_local;
  void *buffer_local;
  CopyingFileOutputStream *this_local;
  
  local_61 = 0;
  local_24 = size;
  pvStack_20 = buffer;
  buffer_local = this;
  if ((this->is_closed_ & 1U) != 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0xed);
    local_61 = 1;
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  pvVar1 = pvStack_20;
  buffer_base._4_4_ = 0;
  while( true ) {
    if (local_24 <= buffer_base._4_4_) {
      return true;
    }
    do {
      sVar3 = write(this->file_,(void *)((long)pvVar1 + (long)buffer_base._4_4_),
                    (long)(local_24 - buffer_base._4_4_));
      iVar2 = (int)sVar3;
      bVar5 = false;
      if (iVar2 < 0) {
        piVar4 = __errno_location();
        bVar5 = *piVar4 == 4;
      }
    } while (bVar5);
    if (iVar2 < 1) break;
    buffer_base._4_4_ = iVar2 + buffer_base._4_4_;
  }
  if (iVar2 < 0) {
    piVar4 = __errno_location();
    this->errno_ = *piVar4;
  }
  return false;
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Write(
    const void* buffer, int size) {
  GOOGLE_CHECK(!is_closed_);
  int total_written = 0;

  const uint8* buffer_base = reinterpret_cast<const uint8*>(buffer);

  while (total_written < size) {
    int bytes;
    do {
      bytes = write(file_, buffer_base + total_written, size - total_written);
    } while (bytes < 0 && errno == EINTR);

    if (bytes <= 0) {
      // Write error.

      // FIXME(kenton):  According to the man page, if write() returns zero,
      //   there was no error; write() simply did not write anything.  It's
      //   unclear under what circumstances this might happen, but presumably
      //   errno won't be set in this case.  I am confused as to how such an
      //   event should be handled.  For now I'm treating it as an error, since
      //   retrying seems like it could lead to an infinite loop.  I suspect
      //   this never actually happens anyway.

      if (bytes < 0) {
        errno_ = errno;
      }
      return false;
    }
    total_written += bytes;
  }

  return true;
}